

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Get_ghost_block(int g_a,int *lo,int *hi,void *buf,int *ld)

{
  Integer IVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long alStack_f8 [2];
  Integer aIStack_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [8];
  
  alStack_f8[1] = 0x1095cb;
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar2 = &lStack_70 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar2 = (long)lo[lVar4] + 1;
    plVar2 = plVar2 + -1;
  }
  plVar2 = &lStack_b0 + IVar1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar2 = (long)hi[lVar4] + 1;
    plVar2 = plVar2 + -1;
  }
  lVar4 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar4;
  }
  plVar2 = alStack_f8 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar2 = (long)ld[lVar4];
    plVar2 = plVar2 + -1;
  }
  alStack_f8[1] = 0x109661;
  pnga_get_ghost_block((long)g_a,local_68,local_a8,buf,aIStack_e8);
  return;
}

Assistant:

void NGA_Get_ghost_block(int g_a, int lo[], int hi[], void *buf, int ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_get_ghost_block(a, _ga_lo, _ga_hi, buf, _ga_work);
}